

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true> __thiscall
duckdb::FSSTStorage::InitCompression
          (FSSTStorage *this,ColumnDataCheckpointData *checkpoint_data,
          unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
          *analyze_state_p)

{
  _func_int **pp_Var1;
  duckdb_fsst_encoder_t *encoder;
  u32 uVar2;
  pointer pAVar3;
  FSSTCompressionState *this_00;
  pointer pFVar4;
  InternalException *this_01;
  pointer *__ptr;
  templated_unique_single_t compression_state;
  _Head_base<0UL,_duckdb::FSSTCompressionState_*,_false> local_58;
  string local_50;
  
  pAVar3 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>::
           operator->(analyze_state_p);
  this_00 = (FSSTCompressionState *)operator_new(0x990);
  FSSTCompressionState::FSSTCompressionState(this_00,checkpoint_data,&pAVar3->info);
  pp_Var1 = pAVar3[1]._vptr_AnalyzeState;
  local_58._M_head_impl = this_00;
  if (pp_Var1 != (_func_int **)0x0) {
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->((unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
                           *)&local_58);
    pFVar4->fsst_encoder = pp_Var1;
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->((unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
                           *)&local_58);
    encoder = pFVar4->fsst_encoder;
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->((unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
                           *)&local_58);
    uVar2 = duckdb_fsst_export(encoder,pFVar4->fsst_serialized_symbol_table);
    pFVar4 = unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
             ::operator->((unique_ptr<duckdb::FSSTCompressionState,_std::default_delete<duckdb::FSSTCompressionState>,_true>
                           *)&local_58);
    pFVar4->fsst_serialized_symbol_table_size = (ulong)uVar2;
    pAVar3[1]._vptr_AnalyzeState = (_func_int **)0x0;
    *(FSSTCompressionState **)this = local_58._M_head_impl;
    return (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
           (unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>)
           this;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"No encoder found during FSST compression","");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CompressionState> FSSTStorage::InitCompression(ColumnDataCheckpointData &checkpoint_data,
                                                          unique_ptr<AnalyzeState> analyze_state_p) {
	auto &analyze_state = analyze_state_p->Cast<FSSTAnalyzeState>();
	auto compression_state = make_uniq<FSSTCompressionState>(checkpoint_data, analyze_state.info);

	if (analyze_state.fsst_encoder == nullptr) {
		throw InternalException("No encoder found during FSST compression");
	}

	compression_state->fsst_encoder = analyze_state.fsst_encoder;
	compression_state->fsst_serialized_symbol_table_size =
	    duckdb_fsst_export(compression_state->fsst_encoder, &compression_state->fsst_serialized_symbol_table[0]);
	analyze_state.fsst_encoder = nullptr;

	return std::move(compression_state);
}